

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

int __thiscall myGame::Game::loop(Game *this)

{
  bool bVar1;
  finishGame *this_00;
  finishGame e;
  Game *this_local;
  
  while( true ) {
    wait_key(this);
    getFood(this);
    Snake::move(&this->snake);
    Object::clear_dead();
    bVar1 = Snake::is_alive(&this->snake);
    if (!bVar1) break;
    redraw(this);
    usleep(10000);
  }
  this_00 = (finishGame *)__cxa_allocate_exception(1);
  finishGame::finishGame(this_00);
  __cxa_throw(this_00,&finishGame::typeinfo,0);
}

Assistant:

int Game::loop(){
	try{
		while (true){
			wait_key();
			getFood();
			snake.move();
			Object::clear_dead();
			if (!snake.is_alive()){
				throw finishGame();
			}
			redraw();
			usleep(10000);
		}
	}
	catch(finishGame e){
		if (e()){
			clear();
			return snake.get_points();
		}
		else{
			return loop();
		}
	}
}